

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_mus_opl.cpp
# Opt level: O3

void __thiscall OPLMUSSong::OPLMUSSong(OPLMUSSong *this,FileReader *reader,char *args)

{
  int iVar1;
  OPLmusicFile *this_00;
  undefined4 extraout_var;
  
  MusInfo::MusInfo((MusInfo *)this);
  (this->super_StreamSong).m_Stream = (SoundStream *)0x0;
  (this->super_StreamSong).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__OPLMUSSong_006f0b20;
  current_opl_core = opl_core.Value;
  if ((args != (char *)0x0) && ((*args & 0xfcU) == 0x30)) {
    current_opl_core = (int)(byte)(*args - 0x30);
  }
  this_00 = (OPLmusicFile *)operator_new(0xca8);
  OPLmusicFile::OPLmusicFile(this_00,reader);
  this->Music = this_00;
  iVar1 = (*GSnd->_vptr_SoundRenderer[0xb])
                    (GSnd,FillStream,0x377c,(ulong)((current_opl_core == 0) + 8),0xc234,this);
  (this->super_StreamSong).m_Stream = (SoundStream *)CONCAT44(extraout_var,iVar1);
  if ((SoundStream *)CONCAT44(extraout_var,iVar1) == (SoundStream *)0x0) {
    Printf(200,"Could not create music stream.\n");
    if (this->Music != (OPLmusicFile *)0x0) {
      (*(this->Music->super_OPLmusicBlock)._vptr_OPLmusicBlock[1])();
      return;
    }
  }
  else {
    OPL_Active = 1;
  }
  return;
}

Assistant:

OPLMUSSong::OPLMUSSong (FileReader &reader, const char *args)
{
	int samples = int(OPL_SAMPLE_RATE / 14);

	OPL_SetCore(args);
	Music = new OPLmusicFile (&reader);

	m_Stream = GSnd->CreateStream (FillStream, samples*4,
		(current_opl_core == 0 ? SoundStream::Mono : 0) | SoundStream::Float, int(OPL_SAMPLE_RATE), this);
	if (m_Stream == NULL)
	{
		Printf (PRINT_BOLD, "Could not create music stream.\n");
		delete Music;
		return;
	}
	OPL_Active = true;
}